

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O1

int Abc_NodeIsAnd2(Abc_Obj_t *pNode)

{
  Abc_NtkFunc_t AVar1;
  Mio_Gate_t *pMVar2;
  uint uVar3;
  int iVar4;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar5;
  
  if (pNode->pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x388,"int Abc_NodeIsAnd2(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    uVar3 = 0;
    if ((pNode->vFanins).nSize == 2) {
      AVar1 = pNode->pNtk->ntkFunc;
      if (AVar1 != ABC_FUNC_MAP) {
        if (AVar1 == ABC_FUNC_SOP) {
          iVar4 = Abc_SopIsAndType((char *)(pNode->field_5).pData);
          return iVar4;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                      ,0x390,"int Abc_NodeIsAnd2(Abc_Obj_t *)");
      }
      pMVar2 = (Mio_Gate_t *)(pNode->field_5).pData;
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pMVar5 = Mio_LibraryReadAnd2(pLib);
      uVar3 = (uint)(pMVar2 == pMVar5);
    }
    return uVar3;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                ,0x389,"int Abc_NodeIsAnd2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsAnd2( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 2 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
    return Abc_SopIsAndType(((char *)pNode->pData));
    if ( Abc_NtkHasMapping(pNtk) )
        return pNode->pData == (void *)Mio_LibraryReadAnd2((Mio_Library_t *)Abc_FrameReadLibGen());
    assert( 0 );
    return 0;
}